

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinetics-observer.cpp
# Opt level: O2

void __thiscall
stateObservation::KineticsObserver::setContactProcessCovMat
          (KineticsObserver *this,int contactNbr,Matrix12 *contactCovMat)

{
  ExtendedKalmanFilter *pEVar1;
  uint blockIndex;
  Matrix P;
  Matrix local_50;
  Matrix local_38;
  
  pEVar1 = &this->ekf_;
  (*(this->ekf_).super_KalmanFilterBase.super_ZeroDelayObserver.super_ObserverBase.
    _vptr_ObserverBase[0x32])(&local_50,pEVar1);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Matrix<double,12,12,0,12,12>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_38,
             (DenseBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_> *)contactCovMat);
  blockIndex = contactIndexTangent(this,contactNbr);
  setBlockStateCovariance<12>(&local_50,&local_38,blockIndex);
  free(local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  (*(pEVar1->super_KalmanFilterBase).super_ZeroDelayObserver.super_ObserverBase._vptr_ObserverBase
    [0x31])(pEVar1,&local_50);
  free(local_50.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  return;
}

Assistant:

void KineticsObserver::setContactProcessCovMat(int contactNbr, const Matrix12 & contactCovMat)
{
  Matrix P = ekf_.getProcessCovariance();
  setBlockStateCovariance<sizeContactTangent>(P, contactCovMat, contactIndexTangent(contactNbr));
  ekf_.setProcessCovariance(P);
}